

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.hpp
# Opt level: O2

string * __thiscall
pstore::indirect_string::to_string_abi_cxx11_(string *__return_storage_ptr__,indirect_string *this)

{
  shared_sstring_view owner;
  allocator<char> local_49;
  sstring_view<std::shared_ptr<const_char>_> local_48;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_30;
  raw_sstring_view local_28;
  
  local_30.ptr_ = &local_48;
  local_48.size_ = 0;
  local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_30);
  local_28 = as_string_view(this,local_30);
  sstring_view<char_const*>::to_string<std::allocator<char>>
            (__return_storage_ptr__,(sstring_view<char_const*> *)&local_28,&local_49);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string () const {
            shared_sstring_view owner;
            return this->as_string_view (&owner).to_string ();
        }